

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_core_module.c
# Opt level: O2

char * ngx_http_core_try_files(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_str_t *value;
  undefined8 *puVar1;
  void *pvVar2;
  ngx_array_t *pnVar3;
  ngx_uint_t nVar4;
  ngx_int_t nVar5;
  char *pcVar6;
  ngx_http_core_loc_conf_t *clcf;
  ulong uVar7;
  ngx_array_t **ppnVar8;
  ngx_http_script_compile_t local_88;
  
  if (*(long *)((long)conf + 0x248) != 0) {
    return "is duplicate";
  }
  *(undefined8 *)(*(long *)(*cf->ctx + ngx_http_core_module.ctx_index * 8) + 0xe8) = 1;
  pvVar2 = ngx_pcalloc(cf->pool,cf->args->nelts * 0x28);
  pcVar6 = (char *)0xffffffffffffffff;
  if (pvVar2 != (void *)0x0) {
    *(void **)((long)conf + 0x248) = pvVar2;
    pnVar3 = cf->args;
    ppnVar8 = (ngx_array_t **)((long)pvVar2 + 8);
    puVar1 = (undefined8 *)pnVar3->elts;
    for (uVar7 = 2; uVar7 - 2 < pnVar3->nelts - 1; uVar7 = uVar7 + 1) {
      pnVar3 = (ngx_array_t *)puVar1[3];
      ppnVar8[1] = (ngx_array_t *)puVar1[2];
      ppnVar8[2] = pnVar3;
      pnVar3 = ppnVar8[1];
      if (((pnVar3 != (ngx_array_t *)0x0) &&
          (((undefined1 *)((long)&ppnVar8[2][-1].pool + 7))[(long)pnVar3] == '/')) &&
         (uVar7 < cf->args->nelts)) {
        *(byte *)((long)ppnVar8 + 0x19) = *(byte *)((long)ppnVar8 + 0x19) | 4;
        ppnVar8[1] = (ngx_array_t *)((long)&pnVar3[-1].pool + 7);
        ((undefined1 *)((long)&ppnVar8[2][-1].pool + 7))[(long)pnVar3] = 0;
      }
      value = (ngx_str_t *)(ppnVar8 + 1);
      nVar4 = ngx_http_script_variables_count(value);
      if (nVar4 == 0) {
        value->len = value->len + 1;
      }
      else {
        local_88.lengths = ppnVar8 + -1;
        local_88.size = 0;
        local_88.main = (void *)0x0;
        local_88.ncaptures = 0;
        local_88.captures_mask = 0;
        local_88.flushes = (ngx_array_t **)0x0;
        local_88._80_8_ = 6;
        local_88.cf = cf;
        local_88.source = value;
        local_88.values = ppnVar8;
        local_88.variables = nVar4;
        nVar5 = ngx_http_script_compile(&local_88);
        if (nVar5 != 0) {
          return (char *)0xffffffffffffffff;
        }
      }
      pnVar3 = cf->args;
      ppnVar8 = ppnVar8 + 5;
      puVar1 = puVar1 + 2;
    }
    if (*(char *)&ppnVar8[-3]->elts == '=') {
      nVar5 = ngx_atoi((u_char *)((long)&ppnVar8[-3]->elts + 1),
                       (size_t)((long)&ppnVar8[-4][-1].pool + 6));
      if (nVar5 == -1 || 999 < nVar5) {
        ngx_conf_log_error(1,cf,0,"invalid code \"%*s\"",
                           (undefined1 *)((long)&ppnVar8[-4][-1].pool + 7),ppnVar8[-3]);
        return (char *)0xffffffffffffffff;
      }
      *(ushort *)(ppnVar8 + 3) =
           (ushort)*(undefined4 *)(ppnVar8 + 3) & 0xfc00 | (ushort)nVar5 & 0x3ff;
    }
    pcVar6 = (char *)0x0;
  }
  return pcVar6;
}

Assistant:

static char *
ngx_http_core_try_files(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_core_loc_conf_t *clcf = conf;

    ngx_str_t                  *value;
    ngx_int_t                   code;
    ngx_uint_t                  i, n;
    ngx_http_try_file_t        *tf;
    ngx_http_script_compile_t   sc;
    ngx_http_core_main_conf_t  *cmcf;

    if (clcf->try_files) {
        return "is duplicate";
    }

    cmcf = ngx_http_conf_get_module_main_conf(cf, ngx_http_core_module);

    cmcf->try_files = 1;

    tf = ngx_pcalloc(cf->pool, cf->args->nelts * sizeof(ngx_http_try_file_t));
    if (tf == NULL) {
        return NGX_CONF_ERROR;
    }

    clcf->try_files = tf;

    value = cf->args->elts;

    for (i = 0; i < cf->args->nelts - 1; i++) {

        tf[i].name = value[i + 1];

        if (tf[i].name.len > 0
            && tf[i].name.data[tf[i].name.len - 1] == '/'
            && i + 2 < cf->args->nelts)
        {
            tf[i].test_dir = 1;
            tf[i].name.len--;
            tf[i].name.data[tf[i].name.len] = '\0';
        }

        n = ngx_http_script_variables_count(&tf[i].name);

        if (n) {
            ngx_memzero(&sc, sizeof(ngx_http_script_compile_t));

            sc.cf = cf;
            sc.source = &tf[i].name;
            sc.lengths = &tf[i].lengths;
            sc.values = &tf[i].values;
            sc.variables = n;
            sc.complete_lengths = 1;
            sc.complete_values = 1;

            if (ngx_http_script_compile(&sc) != NGX_OK) {
                return NGX_CONF_ERROR;
            }

        } else {
            /* add trailing '\0' to length */
            tf[i].name.len++;
        }
    }

    if (tf[i - 1].name.data[0] == '=') {

        code = ngx_atoi(tf[i - 1].name.data + 1, tf[i - 1].name.len - 2);

        if (code == NGX_ERROR || code > 999) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "invalid code \"%*s\"",
                               tf[i - 1].name.len - 1, tf[i - 1].name.data);
            return NGX_CONF_ERROR;
        }

        tf[i].code = code;
    }

    return NGX_CONF_OK;
}